

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

AsyncRequest * __thiscall
ot::commissioner::CommissionerSafe::PopAsyncRequest
          (AsyncRequest *__return_storage_ptr__,CommissionerSafe *this)

{
  bool bVar1;
  reference __x;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> _;
  CommissionerSafe *this_local;
  value_type *ret;
  
  _._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mInvokeMutex);
  bVar1 = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::empty(&this->mAsyncRequestQueue);
  if (bVar1) {
    std::function<void_()>::function(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    __x = std::
          queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
          ::front(&this->mAsyncRequestQueue);
    std::function<void_()>::function(__return_storage_ptr__,__x);
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::pop(&this->mAsyncRequestQueue);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return __return_storage_ptr__;
}

Assistant:

CommissionerSafe::AsyncRequest CommissionerSafe::PopAsyncRequest()
{
    std::lock_guard<std::mutex> _(mInvokeMutex);

    if (!mAsyncRequestQueue.empty())
    {
        auto ret = mAsyncRequestQueue.front();
        mAsyncRequestQueue.pop();
        return ret;
    }
    return nullptr;
}